

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<OrderedScreen>::relocate
          (QArrayDataPointer<OrderedScreen> *this,qsizetype offset,OrderedScreen **data)

{
  bool bVar1;
  long n;
  OrderedScreen *in_RDX;
  long in_RSI;
  OrderedScreen *in_RDI;
  OrderedScreen **unaff_retaddr;
  OrderedScreen *res;
  OrderedScreen *c;
  
  n = *(long *)&in_RDI->vinfo + in_RSI * 0x100;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<OrderedScreen,long_long>(in_RDX,n,in_RDI);
  if ((in_RDX != (OrderedScreen *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<OrderedScreen>,OrderedScreen_const*>
                        (unaff_retaddr,(QArrayDataPointer<OrderedScreen> *)c), bVar1)) {
    in_RDX->screen = in_RDX->screen + in_RSI * 0x100;
  }
  (in_RDI->vinfo).virtualIndex = (int)n;
  (in_RDI->vinfo).virtualPos.xp = (Representation)(int)((ulong)n >> 0x20);
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }